

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this,Psbt *psbt)

{
  Psbt *in_RSI;
  Psbt *in_RDI;
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  *in_stack_ffffffffffffffa8;
  Psbt *this_00;
  ByteData local_28;
  
  core::Psbt::GetData(&local_28,in_RSI);
  core::Psbt::Psbt(in_RDI,&local_28);
  core::ByteData::~ByteData((ByteData *)0x51c4a7);
  in_RDI->_vptr_Psbt = (_func_int **)&PTR__Psbt_009efca8;
  this_00 = in_RDI + 1;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x51c4c4);
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  operator=((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
             *)this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

Psbt::Psbt(const Psbt& psbt) : cfd::core::Psbt(psbt.GetData()) {
  verify_ignore_map_ = psbt.verify_ignore_map_;
}